

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yebash.cpp
# Opt level: O2

void printSuggestion(HistorySuggestion *history,Printer *printer,LineBuffer *buffer,int offset)

{
  pointer pcVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Color *pCVar3;
  Color color;
  undefined1 local_68 [8];
  StringOpt suggestion;
  string pattern;
  
  __s = yb::LineBuffer::get(buffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &suggestion.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_engaged,__s,(allocator<char> *)local_68);
  if (offset == 0) {
    yb::HistorySuggestion::findNextSuggestion
              ((StringOpt *)local_68,history,
               (string *)
               &suggestion.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_engaged);
  }
  else {
    yb::HistorySuggestion::findSuggestion
              ((StringOpt *)local_68,history,
               (string *)
               &suggestion.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ._M_engaged);
  }
  if (suggestion.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      .field_0._24_1_ == '\0') {
    yb::Printer::clearTerminalLine(printer);
  }
  else {
    pbVar2 = std::experimental::fundamentals_v1::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_68);
    if (pattern._M_dataplus._M_p != (pointer)pbVar2->_M_string_length) {
      pbVar2 = std::experimental::fundamentals_v1::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_68);
      pcVar1 = (pbVar2->_M_dataplus)._M_p;
      pCVar3 = (Color *)__tls_get_addr(&PTR_00111f10);
      if ((char)pCVar3[1] == reset) {
        color = grey;
      }
      else {
        color = *pCVar3;
      }
      yb::Printer::print(printer,pattern._M_dataplus._M_p + (long)pcVar1,color,offset);
    }
  }
  std::experimental::fundamentals_v1::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  ::~_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     *)local_68);
  std::__cxx11::string::~string
            ((string *)
             &suggestion.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_engaged);
  return;
}

Assistant:

void printSuggestion(HistorySuggestion &history, Printer &printer, LineBuffer &buffer, int offset) {
    std::string pattern{buffer.get()};
    auto suggestion = offset ? history.findSuggestion(pattern) : history.findNextSuggestion(pattern);
    if (!suggestion) {
        printer.clearTerminalLine();
        return;
    }
    if (pattern.length() == suggestion.value().length()) {
        return;
    }
    printer.print(suggestion.value().c_str() + pattern.length(), suggestionColor.value_or(defaultSuggestionColor), offset);
}